

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

int recff_bit64_nary(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  IRRef1 IVar2;
  CTypeID CVar3;
  TRef TVar5;
  CType *d;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  CTState *cts;
  uint k;
  TRef TVar4;
  
  if (*J->base != 0) {
    cts = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
    uVar6 = 0;
    uVar7 = 1;
    k = 0;
    do {
      CVar3 = crec_bit64_type(cts,rd->argv + uVar6);
      if (CVar3 < k) {
        CVar3 = k;
      }
      k = CVar3;
      uVar6 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (J->base[uVar6] != 0);
    if (k != 0) {
      d = cts->tab + k;
      uVar1 = rd->data;
      TVar4 = crec_bit64_arg(J,d,*J->base,rd->argv);
      IVar2 = (IRRef1)TVar4;
      TVar5 = J->base[1];
      if (TVar5 != 0) {
        uVar6 = 1;
        uVar8 = 2;
        do {
          TVar5 = crec_bit64_arg(J,d,TVar5,rd->argv + uVar6);
          (J->fold).ins.field_0.ot = (short)k + 10U | (ushort)(uVar1 << 8);
          (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
          TVar4 = lj_opt_fold(J);
          IVar2 = (IRRef1)TVar4;
          TVar5 = J->base[uVar8];
          uVar6 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (TVar5 != 0);
      }
      TVar5 = lj_ir_kint(J,k);
      (J->fold).ins.field_0.ot = 0x528a;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
      (J->fold).ins.field_0.op2 = IVar2;
      TVar5 = lj_opt_fold(J);
      *J->base = TVar5;
      return 1;
    }
  }
  return 0;
}

Assistant:

int LJ_FASTCALL recff_bit64_nary(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = 0;
  MSize i;
  for (i = 0; J->base[i] != 0; i++) {
    CTypeID aid = crec_bit64_type(cts, &rd->argv[i]);
    if (id < aid) id = aid;  /* Determine highest type rank of all arguments. */
  }
  if (id) {
    CType *ct = ctype_get(cts, id);
    uint32_t ot = IRT(rd->data, id-CTID_INT64+IRT_I64);
    TRef tr = crec_bit64_arg(J, ct, J->base[0], &rd->argv[0]);
    for (i = 1; J->base[i] != 0; i++) {
      TRef tr2 = crec_bit64_arg(J, ct, J->base[i], &rd->argv[i]);
      tr = emitir(ot, tr, tr2);
    }
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}